

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2publicvectors.c
# Opt level: O0

void test_v2publicvectors(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  void *__s2;
  uint8_t *puVar8;
  uint8_t *dec;
  size_t footer_len;
  uint8_t *footer;
  size_t dec_len;
  char *enc;
  test_case_conflict *case_;
  test_case_conflict *cases;
  uint8_t secret_key [64];
  uint8_t public_key [32];
  
  bVar4 = paseto_v2_public_load_secret_key_hex
                    (&cases,
                     "b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a37741eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
                    );
  if ((bVar4 & 1) != 1) {
    __assert_fail("paseto_v2_public_load_secret_key_hex(secret_key, \"b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a3774\" \"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2\" ) == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                  ,0x45,"void test_v2publicvectors(void)");
  }
  bVar4 = paseto_v2_public_load_public_key_hex
                    (secret_key + 0x38,
                     "1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2");
  if ((bVar4 & 1) != 1) {
    __assert_fail("paseto_v2_public_load_public_key_hex(public_key, \"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2\" ) == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                  ,0x48,"void test_v2publicvectors(void)");
  }
  enc = (char *)load_csv();
  case_ = (test_case_conflict *)enc;
  while( true ) {
    if (enc == (char *)0x0) {
      return;
    }
    printf("Running test \'%s\'...",*(undefined8 *)(enc + 8));
    uVar1 = *(undefined8 *)(enc + 0x18);
    sVar6 = strlen(*(char **)(enc + 0x18));
    uVar2 = *(undefined8 *)(enc + 0x20);
    sVar7 = strlen(*(char **)(enc + 0x20));
    dec_len = paseto_v2_public_sign(uVar1,sVar6,&cases,uVar2,sVar7);
    if (dec_len == 0) {
      perror("paseto_v2_public_sign failed");
    }
    if (dec_len == 0) {
      __assert_fail("enc != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                    ,0x52,"void test_v2publicvectors(void)");
    }
    iVar5 = strcmp(*(char **)(enc + 0x28),(char *)dec_len);
    if (iVar5 != 0) {
      __assert_fail("strcmp(case_->signed_message, enc) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                    ,0x53,"void test_v2publicvectors(void)");
    }
    free((void *)dec_len);
    printf(" signing ok...");
    __s2 = (void *)paseto_v2_public_verify
                             (*(undefined8 *)(enc + 0x28),&footer,secret_key + 0x38,&footer_len,&dec
                             );
    puVar3 = footer;
    if (__s2 == (void *)0x0) break;
    puVar8 = (uint8_t *)strlen(*(char **)(enc + 0x18));
    if (puVar3 != puVar8) {
      __assert_fail("dec_len == strlen(case_->message)",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                    ,0x60,"void test_v2publicvectors(void)");
    }
    iVar5 = memcmp(*(void **)(enc + 0x18),__s2,(size_t)footer);
    if (iVar5 != 0) {
      __assert_fail("memcmp(case_->message, dec, dec_len) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                    ,0x61,"void test_v2publicvectors(void)");
    }
    paseto_free(__s2);
    sVar6 = strlen(*(char **)(enc + 0x20));
    puVar3 = dec;
    if (sVar6 == 0) {
      if (footer_len != 0) {
        __assert_fail("footer == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,100,"void test_v2publicvectors(void)");
      }
      if (dec != (uint8_t *)0x0) {
        __assert_fail("footer_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x65,"void test_v2publicvectors(void)");
      }
    }
    else {
      if (footer_len == 0) {
        __assert_fail("footer != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x67,"void test_v2publicvectors(void)");
      }
      puVar8 = (uint8_t *)strlen(*(char **)(enc + 0x20));
      if (puVar3 != puVar8) {
        __assert_fail("footer_len == strlen(case_->footer)",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x68,"void test_v2publicvectors(void)");
      }
      iVar5 = strcmp(*(char **)(enc + 0x20),(char *)footer_len);
      if (iVar5 != 0) {
        __assert_fail("strcmp(case_->footer, (const char *) footer) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x69,"void test_v2publicvectors(void)");
      }
      paseto_free(footer_len);
    }
    printf(" verifying ok\n");
    enc = *(char **)enc;
  }
  perror("paseto_v2_public_verify failed");
  __assert_fail("dec != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                ,0x5f,"void test_v2publicvectors(void)");
}

Assistant:

void test_v2publicvectors(void) {
    uint8_t public_key[paseto_v2_PUBLIC_PUBLICKEYBYTES];
    uint8_t secret_key[paseto_v2_PUBLIC_SECRETKEYBYTES];
    assert(paseto_v2_public_load_secret_key_hex(secret_key,
            "b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a3774"
            "1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
            ) == true);
    assert(paseto_v2_public_load_public_key_hex(public_key,
            "1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
            ) == true);

    struct test_case *cases = load_csv();
    for (struct test_case *case_ = cases; case_; case_ = case_->next) {
        printf("Running test '%s'...", case_->name);
        char *enc = paseto_v2_public_sign(
                (const uint8_t *) case_->message, strlen(case_->message),
                secret_key,
                (const uint8_t *) case_->footer, strlen(case_->footer));
        if (!enc) perror("paseto_v2_public_sign failed");
        assert(enc != NULL);
        assert(strcmp(case_->signed_message, enc) == 0);
        free(enc);
        printf(" signing ok...");

        size_t dec_len;
        uint8_t *footer;
        size_t footer_len;
        uint8_t *dec = paseto_v2_public_verify(
                case_->signed_message, &dec_len,
                public_key,
                &footer, &footer_len);
        if (!dec) perror("paseto_v2_public_verify failed");
        assert(dec != NULL);
        assert(dec_len == strlen(case_->message));
        assert(memcmp(case_->message, dec, dec_len) == 0);
        paseto_free(dec);
        if (strlen(case_->footer) == 0) {
            assert(footer == NULL);
            assert(footer_len == 0);
        } else {
            assert(footer != NULL);
            assert(footer_len == strlen(case_->footer));
            assert(strcmp(case_->footer, (const char *) footer) == 0);
            paseto_free(footer);
        }
        printf(" verifying ok\n");
    }
}